

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

VulkanMock * get_vulkan_mock(void)

{
  VulkanMock local_d8;
  
  local_d8.api_version = 0x403000;
  memset(&local_d8.instance_extensions,0,0xc0);
  VulkanMock::operator=(&mock,&local_d8);
  VulkanMock::~VulkanMock(&local_d8);
  return &mock;
}

Assistant:

VulkanMock* get_vulkan_mock() {
    mock = VulkanMock{};
    return &mock;
}